

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_set_server_name(ptls_t *tls,char *server_name,size_t server_name_len)

{
  char *local_30;
  char *duped;
  size_t server_name_len_local;
  char *server_name_local;
  ptls_t *tls_local;
  
  local_30 = (char *)0x0;
  if (server_name != (char *)0x0) {
    duped = (char *)server_name_len;
    if (server_name_len == 0) {
      duped = (char *)strlen(server_name);
    }
    local_30 = (char *)malloc((size_t)(duped + 1));
    if (local_30 == (char *)0x0) {
      return 0x201;
    }
    memcpy(local_30,server_name,(size_t)duped);
    local_30[(long)duped] = '\0';
  }
  free(tls->server_name);
  tls->server_name = local_30;
  return 0;
}

Assistant:

int ptls_set_server_name(ptls_t *tls, const char *server_name, size_t server_name_len)
{
    char *duped = NULL;

    if (server_name != NULL) {
        if (server_name_len == 0)
            server_name_len = strlen(server_name);
        if ((duped = malloc(server_name_len + 1)) == NULL)
            return PTLS_ERROR_NO_MEMORY;
        memcpy(duped, server_name, server_name_len);
        duped[server_name_len] = '\0';
    }

    free(tls->server_name);
    tls->server_name = duped;

    return 0;
}